

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Count<phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Count<phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer ppVar3;
  long lVar4;
  pair<const_int,_phmap::priv::NonStandardLayout> *p;
  pointer ppVar5;
  char *pcVar6;
  SharedLock m_1;
  AssertionResult gtest_ar;
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  values;
  TypeParam m;
  DoNothing local_519;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_518;
  internal local_510 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  AssertHelper local_500;
  undefined1 local_4f8 [24];
  __normal_iterator<std::pair<const_int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_>
  a_Stack_4e0 [3];
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_4c8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_4b0;
  
  local_4c8.
  super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<const_int,_phmap::priv::NonStandardLayout> *)0x0
  ;
  local_4c8.
  super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<const_int,_phmap::priv::NonStandardLayout> *)0x0;
  local_4c8.
  super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int_const,phmap::priv::NonStandardLayout>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,phmap::priv::NonStandardLayout>,void>>
            ();
  ppVar3 = local_4c8.
           super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)&a_Stack_4e0[0]._M_current + lVar4) = 0;
    *(undefined8 *)((long)&a_Stack_4e0[1]._M_current + lVar4) = 0;
    *(undefined8 *)(local_4f8 + lVar4 + 8) = 0;
    *(undefined8 *)((long)&a_Stack_4e0[-1]._M_current + lVar4) = 0;
    *(undefined8 *)
     ((long)&local_4c8.
             super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4) = 0;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x4c0);
  if (local_4c8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4c8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_4c8.
             super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_500.data_._0_4_ = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)ppVar5->first;
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
      ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                ((iterator *)local_4f8,
                 (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                  *)&local_4b0,&ppVar5->first,
                 SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_519);
      local_518._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((Inner *)local_4f8._0_8_ != (Inner *)0x0);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_510,"0","m.count(p.first)",(int *)&local_500,(unsigned_long *)&local_518);
      if (local_510[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_518);
        testing::PrintToString<int>((string *)local_4f8,&ppVar5->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_518._M_head_impl + 0x10),(char *)local_4f8._0_8_,
                   local_4f8._8_8_);
        pcVar6 = "";
        if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = (local_508->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_500,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x4a,pcVar6);
        testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
        testing::internal::AssertHelper::~AssertHelper(&local_500);
        if ((Inner *)local_4f8._0_8_ != (Inner *)(local_4f8 + 0x10)) {
          operator_delete((void *)local_4f8._0_8_,(ulong)(local_4f8._16_8_ + 1));
        }
        if (local_518._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_518._M_head_impl + 8))();
        }
      }
      if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_508,local_508);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar3);
  }
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<int_const,phmap::priv::NonStandardLayout>*,std::vector<std::pair<int_const,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int_const,phmap::priv::NonStandardLayout>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_4b0,
             (__normal_iterator<std::pair<const_int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_>
              )local_4c8.
               super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<const_int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_>
              )local_4c8.
               super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  ppVar3 = local_4c8.
           super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4c8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4c8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_4c8.
             super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_500.data_._0_4_ = 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)ppVar5->first;
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
      ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                ((iterator *)local_4f8,
                 (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                  *)&local_4b0,&ppVar5->first,
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),&local_519);
      local_518._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((Inner *)local_4f8._0_8_ != (Inner *)0x0);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_510,"1","m.count(p.first)",(int *)&local_500,(unsigned_long *)&local_518);
      if (local_510[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_518);
        testing::PrintToString<int>((string *)local_4f8,&ppVar5->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_518._M_head_impl + 0x10),(char *)local_4f8._0_8_,
                   local_4f8._8_8_);
        pcVar6 = "";
        if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = (local_508->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_500,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x4d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
        testing::internal::AssertHelper::~AssertHelper(&local_500);
        if ((Inner *)local_4f8._0_8_ != (Inner *)(local_4f8 + 0x10)) {
          operator_delete((void *)local_4f8._0_8_,(ulong)(local_4f8._16_8_ + 1));
        }
        if (local_518._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_518._M_head_impl + 8))();
        }
      }
      if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_508,local_508);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar3);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_4b0);
  std::
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector(&local_4c8);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}